

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::timestamp_t,duckdb::dtime_tz_t>
          (BaseAppender *this,Vector *col,timestamp_t input)

{
  bool bVar1;
  undefined1 auVar2 [16];
  dtime_tz_t result;
  dtime_tz_t local_48;
  string local_40;
  
  bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::dtime_tz_t>(input,&local_48,false);
  if (bVar1) {
    *(uint64_t *)(col->data + (this->chunk).count * 8) = local_48.bits;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::timestamp_t,duckdb::dtime_tz_t>
            (&local_40,(duckdb *)input.value,(timestamp_t)auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_40);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}